

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool Catch::endsWith(string *s,string *suffix)

{
  string *psVar1;
  ulong uVar2;
  ulong uVar3;
  __type local_42;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *suffix_local;
  string *s_local;
  
  local_20 = suffix;
  suffix_local = s;
  uVar2 = std::__cxx11::string::size();
  uVar3 = std::__cxx11::string::size();
  psVar1 = suffix_local;
  local_42 = false;
  if (uVar3 <= uVar2) {
    std::__cxx11::string::size();
    std::__cxx11::string::size();
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&local_40,(ulong)psVar1);
    local_42 = std::operator==(&local_40,local_20);
  }
  s_local._7_1_ = local_42;
  if (uVar3 <= uVar2) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  return (bool)(s_local._7_1_ & 1);
}

Assistant:

bool endsWith( std::string const& s, std::string const& suffix ) {
        return s.size() >= suffix.size() && s.substr( s.size()-suffix.size(), suffix.size() ) == suffix;
    }